

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestExtensionRangeSerialize::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  Nonnull<const_char_*> pcVar3;
  
  if (from_msg == to_msg) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      *(undefined4 *)&to_msg[3]._vptr_MessageLite = *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&to_msg[3]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[3]._vptr_MessageLite + 4);
    }
    if ((uVar1 & 4) != 0) {
      *(int *)&to_msg[3]._internal_metadata_.ptr_ = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&to_msg[3]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
  }
  *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
  google::protobuf::internal::ExtensionSet::MergeFrom
            ((ExtensionSet *)(to_msg + 1),
             (MessageLite *)_TestExtensionRangeSerialize_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestExtensionRangeSerialize::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestExtensionRangeSerialize*>(&to_msg);
  auto& from = static_cast<const TestExtensionRangeSerialize&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestExtensionRangeSerialize)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.foo_one_ = from._impl_.foo_one_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.foo_two_ = from._impl_.foo_two_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.foo_three_ = from._impl_.foo_three_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.foo_four_ = from._impl_.foo_four_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}